

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O3

void * pool_buffer_iter(chck_pool_buffer *pb,size_t *iter,_Bool reverse)

{
  void *pvVar1;
  
  if ((pb->member == 0) || (pb->used / pb->member <= *iter)) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = pool_buffer_get(pb,*iter);
    *iter = *iter + (-(ulong)reverse | 1);
  }
  return pvVar1;
}

Assistant:

static void*
pool_buffer_iter(const struct chck_pool_buffer *pb, size_t *iter, bool reverse)
{
   assert(pb && iter);

   if (!pb->member || *iter >= pb->used / pb->member)
      return NULL;

   void *ptr = pool_buffer_get(pb, *iter);
   (*iter) += (reverse ? -1 : 1);
   return ptr;
}